

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void dump_info(ostream *os,char *name,char *txt)

{
  _Setw _Var1;
  ostream *poVar2;
  char *txt_local;
  char *name_local;
  ostream *os_local;
  
  poVar2 = (ostream *)std::ostream::operator<<(os,std::left);
  _Var1 = std::setw(0x20);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,name);
  poVar2 = std::operator<<(poVar2,":\t");
  poVar2 = std::operator<<(poVar2,txt);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

PRIVATE void dump_info(std::ostream& os, const char* name, const char* txt)
{
	os << std::left << std::setw(32) << name << ":\t" << txt << std::endl;
}